

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

void __thiscall
QAbstractFileEngineHandler::QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  QList<QAbstractFileEngineHandler_*> *this_00;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_01;
  long in_FS_OFFSET;
  QWriteLocker local_18;
  long local_10;
  
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)&local_18;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QAbstractFileEngineHandler = (_func_int **)&PTR__QAbstractFileEngineHandler_00660ac0;
  local_18.q_val =
       (quintptr)
       QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
       operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                   *)this);
  QWriteLocker::relock(&local_18);
  qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i =
       (Type)(__atomic_base<int>)0x1;
  this_00 = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             ::operator()(this_01)->super_QList<QAbstractFileEngineHandler_*>;
  QList<QAbstractFileEngineHandler_*>::prepend(this_00,this);
  QWriteLocker::~QWriteLocker(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineHandler::QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    qt_file_engine_handlers_in_use.storeRelaxed(true);
    fileEngineHandlers()->prepend(this);
}